

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger thread_wakeupthrow(HSQUIRRELVM v)

{
  SQObjectPtr *o_00;
  SQInteger SVar1;
  HSQUIRRELVM dest;
  HSQUIRRELVM src;
  HSQUIRRELVM in_RDI;
  SQBool unaff_retaddr;
  HSQUIRRELVM in_stack_00000008;
  SQBool rethrow_error;
  SQInteger state;
  SQVM *thread;
  SQObjectPtr o;
  SQBool *in_stack_ffffffffffffff78;
  HSQUIRRELVM in_stack_ffffffffffffff80;
  HSQUIRRELVM in_stack_ffffffffffffff88;
  HSQUIRRELVM in_stack_ffffffffffffff90;
  SQObjectType local_20;
  SQObjectValue in_stack_ffffffffffffffe8;
  SQObjectValue throwerror;
  SQBool in_stack_fffffffffffffff8;
  SQRESULT SVar2;
  
  o_00 = stack_get(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)&local_20,o_00);
  if (local_20 != OT_THREAD) {
    SVar2 = sq_throwerror(in_stack_ffffffffffffff80,(SQChar *)in_stack_ffffffffffffff78);
    goto LAB_0012cbf0;
  }
  throwerror = in_stack_ffffffffffffffe8;
  SVar1 = sq_getvmstate(in_stack_ffffffffffffffe8.nInteger);
  if (SVar1 != 2) {
    if (SVar1 == 0) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffff80,(SQChar *)in_stack_ffffffffffffff78);
      goto LAB_0012cbf0;
    }
    if (SVar1 == 1) {
      SVar2 = sq_throwerror(in_stack_ffffffffffffff80,(SQChar *)in_stack_ffffffffffffff78);
      goto LAB_0012cbf0;
    }
  }
  sq_move(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80);
  sq_throwobject((HSQUIRRELVM)0x12ca8b);
  dest = (HSQUIRRELVM)sq_gettop(in_RDI);
  if (2 < (long)dest) {
    sq_getbool(in_stack_ffffffffffffff88,(SQInteger)in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff78);
  }
  src = (HSQUIRRELVM)
        sq_wakeupvm(in_stack_00000008,unaff_retaddr,in_stack_fffffffffffffff8,(SQBool)in_RDI,
                    throwerror.nInteger);
  if ((long)src < 0) {
    sq_settop(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
    SQObjectPtr::operator=((SQObjectPtr *)dest,(SQObjectPtr *)src);
    SVar2 = -1;
  }
  else {
    sq_move(dest,src,(SQInteger)in_stack_ffffffffffffff80);
    sq_pop(in_stack_ffffffffffffff80,(SQInteger)in_stack_ffffffffffffff78);
    in_stack_ffffffffffffff80 =
         (HSQUIRRELVM)sq_getvmstate((HSQUIRRELVM)in_stack_ffffffffffffffe8.pTable);
    if (in_stack_ffffffffffffff80 == (HSQUIRRELVM)0x0) {
      sq_settop((HSQUIRRELVM)0x0,(SQInteger)in_stack_ffffffffffffff78);
    }
    SVar2 = 1;
  }
LAB_0012cbf0:
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff80);
  return SVar2;
}

Assistant:

static SQInteger thread_wakeupthrow(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQVM *thread = _thread(o);
        SQInteger state = sq_getvmstate(thread);
        if(state != SQ_VMSTATE_SUSPENDED) {
            switch(state) {
                case SQ_VMSTATE_IDLE:
                    return sq_throwerror(v,_SC("cannot wakeup a idle thread"));
                break;
                case SQ_VMSTATE_RUNNING:
                    return sq_throwerror(v,_SC("cannot wakeup a running thread"));
                break;
            }
        }

        sq_move(thread,v,2);
        sq_throwobject(thread);
        SQBool rethrow_error = SQTrue;
        if(sq_gettop(v) > 2) {
            sq_getbool(v,3,&rethrow_error);
        }
        if(SQ_SUCCEEDED(sq_wakeupvm(thread,SQFalse,SQTrue,SQTrue,SQTrue))) {
            sq_move(v,thread,-1);
            sq_pop(thread,1); //pop retval
            if(sq_getvmstate(thread) == SQ_VMSTATE_IDLE) {
                sq_settop(thread,1); //pop roottable
            }
            return 1;
        }
        sq_settop(thread,1);
        if(rethrow_error) {
            v->_lasterror = thread->_lasterror;
            return SQ_ERROR;
        }
        return SQ_OK;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}